

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuerySegment.hpp
# Opt level: O2

void __thiscall
cppjieba::QuerySegment::Cut
          (QuerySegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res,bool hmm)

{
  long lVar1;
  DictUnit *pDVar2;
  const_iterator pRVar3;
  long lVar4;
  const_iterator pRVar5;
  ulong uVar6;
  pointer __x;
  WordRange wr;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> mixRes;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> fullRes;
  
  mixRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mixRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mixRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MixSegment::Cut(&this->mixSeg_,begin,end,&mixRes,hmm);
  fullRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fullRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fullRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__x = mixRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
             _M_impl.super__Vector_impl_data._M_start;
      __x != mixRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
             _M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    pRVar5 = __x->left;
    pRVar3 = __x->right;
    lVar1 = ((long)pRVar3 - (long)pRVar5) / 0x14;
    if (lVar1 - 2U < 0xfffffffffffffffd) {
      lVar4 = 0x28;
      for (uVar6 = 1; lVar1 = ((long)pRVar3 - (long)pRVar5) / 0x14, uVar6 < lVar1 + 1U;
          uVar6 = uVar6 + 1) {
        wr.left = (const_iterator)((long)&pRVar5[-2].rune + lVar4);
        wr.right = (const_iterator)((long)&pRVar5[-1].rune + lVar4);
        pDVar2 = DictTrie::Find(this->trie_,wr.left,(const_iterator)((long)&pRVar5->rune + lVar4));
        if (pDVar2 != (DictUnit *)0x0) {
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back(res,&wr)
          ;
        }
        pRVar5 = __x->left;
        pRVar3 = __x->right;
        lVar4 = lVar4 + 0x14;
      }
    }
    if (lVar1 - 3U < 0xfffffffffffffffc) {
      lVar1 = 0x3c;
      for (uVar6 = 2; uVar6 < ((long)pRVar3 - (long)pRVar5) / 0x14 + 1U; uVar6 = uVar6 + 1) {
        wr.left = (const_iterator)((long)&pRVar5[-3].rune + lVar1);
        wr.right = (const_iterator)((long)&pRVar5[-1].rune + lVar1);
        pDVar2 = DictTrie::Find(this->trie_,wr.left,(const_iterator)((long)&pRVar5->rune + lVar1));
        if (pDVar2 != (DictUnit *)0x0) {
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back(res,&wr)
          ;
        }
        pRVar5 = __x->left;
        pRVar3 = __x->right;
        lVar1 = lVar1 + 0x14;
      }
    }
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back(res,__x);
  }
  std::_Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~_Vector_base
            (&fullRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>)
  ;
  std::_Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~_Vector_base
            (&mixRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>);
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res, bool hmm) const {
    //use mix Cut first
    vector<WordRange> mixRes;
    mixSeg_.Cut(begin, end, mixRes, hmm);

    vector<WordRange> fullRes;
    for (vector<WordRange>::const_iterator mixResItr = mixRes.begin(); mixResItr != mixRes.end(); mixResItr++) {
      if (mixResItr->Length() > 2) {
        for (size_t i = 0; i + 1 < mixResItr->Length(); i++) {
          WordRange wr(mixResItr->left + i, mixResItr->left + i + 1);
          if (trie_->Find(wr.left, wr.right + 1) != NULL) {
            res.push_back(wr);
          }
        }
      }
      if (mixResItr->Length() > 3) {
        for (size_t i = 0; i + 2 < mixResItr->Length(); i++) {
          WordRange wr(mixResItr->left + i, mixResItr->left + i + 2);
          if (trie_->Find(wr.left, wr.right + 1) != NULL) {
            res.push_back(wr);
          }
        }
      }
      res.push_back(*mixResItr);
    }
  }